

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall ThreadPool::~ThreadPool(ThreadPool *this)

{
  bool bVar1;
  thread *worker;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  unique_lock<std::mutex> lock;
  ThreadPool *this_local;
  
  this->_vptr_ThreadPool = (_func_int **)&PTR__ThreadPool_003020a8;
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&__range1,&this->_mutex);
  this->_stop = true;
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&__range1);
  std::condition_variable::notify_all();
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->_threads);
  worker = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->_threads);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&worker);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__range1);
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::~queue(&this->_tasks);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->_threads);
  std::condition_variable::~condition_variable(&this->_cond);
  return;
}

Assistant:

inline ThreadPool::~ThreadPool()
{
    std::unique_lock<std::mutex> lock(_mutex);
    _stop = true;
    lock.unlock();

    _cond.notify_all();

    for (auto& worker : _threads)
        worker.join();
}